

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall
chrono::robosimian::RS_WheelDD::Initialize
          (RS_WheelDD *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy)

{
  element_type *peVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChFrame<double> *this_00;
  ChLinkLockRevolute *this_01;
  size_t size;
  shared_ptr<chrono::ChLinkLockRevolute> joint;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  ChLinkLockRevolute *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  ChVector<double> local_198;
  ChCoordsys<double> local_178;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  this_00 = (ChFrame<double> *)
            (**(code **)(*(long *)(chassis->
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x1f0))();
  rpy2quat((ChQuaternion<double> *)&local_140,rpy);
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_b8.coord.pos.m_data[0] = xyz->m_data[0];
  local_b8.coord.pos.m_data[1] = xyz->m_data[1];
  local_b8.coord.pos.m_data[2] = xyz->m_data[2];
  local_b8.coord.rot.m_data[0] = (double)local_140._vptr_ChFrame;
  local_b8.coord.rot.m_data[1] = local_140.coord.pos.m_data[0];
  local_b8.coord.rot.m_data[2] = local_140.coord.pos.m_data[1];
  local_b8.coord.rot.m_data[3] = local_140.coord.pos.m_data[2];
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_140);
  ChFrame<double>::operator*(&local_140,this_00,&local_b8);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs
            ((ChFrame *)
             (this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  RS_Part::AddCollisionShapes(&this->super_RS_Part);
  peVar1 = (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 200))(plVar2,7);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0xd8))(plVar2,5);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar2 = *(long **)(peVar1 + 0x198);
  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0xd8))(plVar2,6);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  size = 1;
  chrono::ChBody::SetCollide
            (SUB81((this->super_RS_Part).m_body.
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  this_01 = (ChLinkLockRevolute *)ChLinkLock::operator_new((ChLinkLock *)0xe90,size);
  ChLinkLockRevolute::ChLinkLockRevolute(this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockRevolute*>
            (&local_1d0,this_01);
  local_1a8 = (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1a0 = (chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
    }
  }
  local_1b8 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1b0 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
    }
  }
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 1.0;
  calcJointFrame(&local_178,&local_140,&local_198);
  (**(code **)(*(long *)this_01 + 0x250))(this_01,&local_1a8,&local_1b8,&local_178);
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  plVar2 = *(long **)((chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + 0x38);
  local_1c0 = local_1d0._M_pi;
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d0._M_pi)->_M_use_count = (local_1d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d0._M_pi)->_M_use_count = (local_1d0._M_pi)->_M_use_count + 1;
    }
  }
  local_1c8 = this_01;
  (**(code **)(*plVar2 + 0x138))(plVar2,&local_1c8);
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
  }
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  return;
}

Assistant:

void RS_WheelDD::Initialize(std::shared_ptr<ChBodyAuxRef> chassis, const ChVector<>& xyz, const ChVector<>& rpy) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                      // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::WHEEL_DD);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::SLED);

    // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
    m_body->SetCollide(true);

    // Add joint
    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(chassis, m_body, calcJointFrame(X_GC, ChVector<>(0, 0, 1)));
    chassis->GetSystem()->AddLink(joint);
}